

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_name.cc
# Opt level: O2

string * absl::flags_internal::ProgramInvocationName_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  Mutex::Lock((Mutex *)&program_name_guard);
  if (program_name_abi_cxx11_ == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"UNKNOWN",&local_9);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,program_name_abi_cxx11_);
  }
  Mutex::Unlock((Mutex *)&program_name_guard);
  return in_RDI;
}

Assistant:

std::string ProgramInvocationName() {
  absl::MutexLock l(&program_name_guard);

  return program_name ? *program_name : "UNKNOWN";
}